

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::DeepScanLineInputFile::Data::LineBufferTask::~LineBufferTask(LineBufferTask *this)

{
  atomic<Imf_3_4::(anonymous_namespace)::ScanLineProcess_*> *paVar1;
  ScanLineProcess *pSVar2;
  ScanLineProcessGroup *pSVar3;
  ScanLineProcess *pSVar4;
  ScanLineProcess *pSVar5;
  bool bVar6;
  
  pSVar2 = this->_line;
  pSVar3 = this->_line_group;
  pSVar4 = (pSVar3->_avail_head)._M_b._M_p;
  do {
    pSVar2->next = pSVar4;
    paVar1 = &pSVar3->_avail_head;
    LOCK();
    pSVar5 = (paVar1->_M_b)._M_p;
    bVar6 = pSVar4 == pSVar5;
    if (bVar6) {
      (paVar1->_M_b)._M_p = pSVar2;
      pSVar5 = pSVar4;
    }
    UNLOCK();
    pSVar4 = pSVar5;
  } while (!bVar6);
  IlmThread_3_4::Semaphore::post();
  IlmThread_3_4::Task::~Task(&this->super_Task);
  return;
}

Assistant:

~LineBufferTask () override
        {
            _line_group->push (_line);
        }